

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  double dVar2;
  qrk_t *qrk;
  ushort *puVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  rdr_t *rdr;
  mdl_t *mdl;
  FILE *pFVar7;
  FILE *__stream;
  char *pcVar8;
  ushort **ppuVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  double *pdVar13;
  dat_t *pdVar14;
  opt_t *poVar15;
  long lVar16;
  anon_struct_16_2_f83984a8 *paVar17;
  ulong uVar18;
  char cVar19;
  char *pcVar20;
  char *pcVar21;
  ulong uVar22;
  char **ppcVar23;
  uint uVar24;
  char *toks [4];
  opt_t opt;
  double local_160;
  char *local_158 [5];
  qrk_t *local_130;
  uint64_t local_128;
  opt_t local_120;
  
  poVar15 = &local_120;
  memcpy(poVar15,&opt_defaults,0xf0);
  opt_parse(argc,argv,poVar15);
  rdr = rdr_new(local_120.maxent);
  mdl = mdl_new(rdr);
  mdl->opt = poVar15;
  switch(local_120.mode) {
  case 0:
    iVar6 = strcmp(local_120.type,"list");
    if (iVar6 == 0) {
      info("Available types of models:\n");
      lVar16 = 0;
      do {
        info("\t%s\n",*(undefined8 *)((long)typ_lst + lVar16));
        lVar16 = lVar16 + 8;
      } while (lVar16 != 0x18);
LAB_001104b8:
      exit(0);
    }
    iVar6 = strcmp(local_120.algo,"list");
    if (iVar6 == 0) {
      info("Available training algorithms:\n");
      lVar16 = 0;
      do {
        info("\t%s\n",*(undefined8 *)((long)&trn_lst[0].name + lVar16));
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x60);
      goto LAB_001104b8;
    }
    ppcVar23 = typ_lst;
    lVar16 = 0;
    while (iVar6 = strcmp(local_120.type,*ppcVar23), iVar6 != 0) {
      lVar16 = lVar16 + 1;
      ppcVar23 = ppcVar23 + 1;
      if (lVar16 == 3) {
        fatal("unknown model type \'%s\'",local_120.type);
      }
    }
    mdl->type = (uint32_t)lVar16;
    paVar17 = trn_lst;
    lVar16 = 0;
    while (iVar6 = strcmp(local_120.algo,paVar17->name), iVar6 != 0) {
      lVar16 = lVar16 + 1;
      paVar17 = paVar17 + 1;
      if (lVar16 == 6) {
        fatal("unknown algorithm \'%s\'",local_120.algo);
      }
    }
    if (local_120.model != (char *)0x0) {
      info("* Load previous model\n");
      pFVar7 = fopen(mdl->opt->model,"r");
      if (pFVar7 == (FILE *)0x0) {
        pfatal("cannot open input model file");
      }
      mdl_load(mdl,(FILE *)pFVar7);
      fclose(pFVar7);
      poVar15 = mdl->opt;
    }
    if (poVar15->pattern != (char *)0x0) {
      info("* Load patterns\n");
      pFVar7 = fopen(mdl->opt->pattern,"r");
      if (pFVar7 == (FILE *)0x0) {
        pfatal("cannot open pattern file");
      }
      rdr_loadpat(mdl->reader,(FILE *)pFVar7);
      fclose(pFVar7);
      qrk_lock(mdl->reader->obs,false);
    }
    info("* Load training data\n");
    pcVar8 = mdl->opt->input;
    pFVar7 = _stdin;
    if ((pcVar8 != (char *)0x0) && (pFVar7 = fopen(pcVar8,"r"), pFVar7 == (FILE *)0x0)) {
      pfatal("cannot open input data file");
      pFVar7 = (FILE *)0x0;
    }
    pdVar14 = rdr_readdat(mdl->reader,(FILE *)pFVar7,true);
    mdl->train = pdVar14;
    if (mdl->opt->input != (char *)0x0) {
      fclose(pFVar7);
    }
    qrk_lock(mdl->reader->lbl,true);
    qrk_lock(mdl->reader->obs,true);
    if ((mdl->train == (dat_t *)0x0) || (mdl->train->nseq == 0)) {
      fatal("no train data loaded");
    }
    if (mdl->opt->devel != (char *)0x0) {
      info("* Load development data\n");
      pFVar7 = fopen(mdl->opt->devel,"r");
      if (pFVar7 == (FILE *)0x0) {
        pfatal("cannot open development file");
      }
      pdVar14 = rdr_readdat(mdl->reader,(FILE *)pFVar7,true);
      mdl->devel = pdVar14;
      fclose(pFVar7);
    }
    pcVar8 = "* Resync the model\n";
    if (mdl->theta == (double *)0x0) {
      pcVar8 = "* Initialize the model\n";
    }
    info(pcVar8);
    mdl_sync(mdl);
    info("* Summary\n");
    info("    nb train:    %u\n",(ulong)mdl->train->nseq);
    if (mdl->devel != (dat_t *)0x0) {
      info("    nb devel:    %u\n",(ulong)mdl->devel->nseq);
    }
    info("    nb labels:   %u\n",(ulong)mdl->nlbl);
    info("    nb blocks:   %lu\n",mdl->nobs);
    info("    nb features: %lu\n",mdl->nftr);
    info("* Train the model with %s\n",mdl->opt->algo);
    uit_setup(mdl);
    (*trn_lst[lVar16].train)(mdl);
    uit_cleanup(mdl);
LAB_00110363:
    poVar15 = mdl->opt;
    break;
  case 1:
    if (local_120.model == (char *)0x0) {
      fatal("you must specify a model");
    }
    info("* Load model\n");
    pFVar7 = fopen(mdl->opt->model,"r");
    if (pFVar7 == (FILE *)0x0) {
      pfatal("cannot open input model file");
    }
    mdl_load(mdl,(FILE *)pFVar7);
    fclose(pFVar7);
    pFVar7 = _stdout;
    pcVar8 = mdl->opt->input;
    __stream = _stdin;
    if ((pcVar8 != (char *)0x0) && (__stream = fopen(pcVar8,"r"), __stream == (FILE *)0x0)) {
      pfatal("cannot open input data file");
      __stream = (FILE *)0x0;
    }
    pcVar8 = mdl->opt->output;
    if ((pcVar8 != (char *)0x0) && (pFVar7 = fopen(pcVar8,"w"), pFVar7 == (FILE *)0x0)) {
      pFVar7 = (FILE *)0x0;
      pfatal("cannot open output data file");
    }
    info("* Label sequences\n");
    tag_label(mdl,(FILE *)__stream,(FILE *)pFVar7);
    info("* Done\n");
    poVar15 = mdl->opt;
    if (poVar15->input != (char *)0x0) {
      fclose(__stream);
      goto LAB_001101a2;
    }
    goto LAB_001101a6;
  case 2:
    info("* Load model\n");
    pcVar8 = mdl->opt->input;
    pFVar7 = _stdin;
    if ((pcVar8 != (char *)0x0) && (pFVar7 = fopen(pcVar8,"r"), pFVar7 == (FILE *)0x0)) {
      pfatal("cannot open input data file");
      pFVar7 = (FILE *)0x0;
    }
    mdl_load(mdl,(FILE *)pFVar7);
    poVar15 = mdl->opt;
    if (poVar15->input != (char *)0x0) {
      fclose(pFVar7);
      poVar15 = mdl->opt;
    }
    pFVar7 = _stdout;
    if ((poVar15->output != (char *)0x0) &&
       (pFVar7 = fopen(poVar15->output,"w"), pFVar7 == (FILE *)0x0)) {
      pfatal("cannot open output data file");
      pFVar7 = (FILE *)0x0;
    }
    info("* Dump model\n");
    uVar24 = mdl->nlbl;
    uVar22 = (ulong)uVar24;
    uVar10 = mdl->nobs;
    qrk = mdl->reader->lbl;
    local_130 = mdl->reader->obs;
    sprintf((char *)local_158,"%%.%df\n",(ulong)(uint)mdl->opt->prec);
    local_128 = uVar10;
    if (uVar10 != 0) {
      uVar10 = 0;
      do {
        pcVar8 = qrk_id2str(local_130,uVar10);
        bVar5 = mdl->kind[uVar10];
        if ((bVar5 & 1) == 0) {
          bVar4 = true;
        }
        else {
          bVar4 = true;
          if (uVar22 != 0) {
            uVar11 = mdl->uoff[uVar10];
            pdVar13 = mdl->theta;
            bVar4 = true;
            uVar12 = 0;
            do {
              if (((mdl->opt->all != false) || (dVar2 = pdVar13[uVar11 + uVar12], dVar2 != 0.0)) ||
                 (NAN(dVar2))) {
                pcVar21 = qrk_id2str(qrk,uVar12);
                bVar4 = false;
                fprintf(pFVar7,"%s\t#\t%s\t",pcVar8,pcVar21);
                fprintf(pFVar7,(char *)local_158,pdVar13[uVar11 + uVar12]);
              }
              uVar12 = uVar12 + 1;
            } while (uVar22 != uVar12);
            bVar5 = mdl->kind[uVar10];
          }
        }
        if (((bVar5 & 2) != 0) && ((ulong)(uVar24 * uVar24) != 0)) {
          uVar11 = mdl->boff[uVar10];
          pdVar13 = mdl->theta;
          uVar18 = 0;
          do {
            if (((mdl->opt->all != false) || (dVar2 = pdVar13[uVar11 + uVar18], dVar2 != 0.0)) ||
               (NAN(dVar2))) {
              bVar4 = false;
              pcVar21 = qrk_id2str(qrk,(uVar18 & 0xffffffff) % uVar22);
              pcVar20 = qrk_id2str(qrk,(uVar18 & 0xffffffff) / uVar22);
              fprintf(pFVar7,"%s\t%s\t%s\t",pcVar8,pcVar20,pcVar21);
              fprintf(pFVar7,(char *)local_158,pdVar13[uVar11 + uVar18]);
            }
            uVar18 = uVar18 + 1;
          } while (uVar24 * uVar24 != uVar18);
        }
        if (!bVar4) {
          fputc(10,pFVar7);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_128);
    }
LAB_001101a2:
    poVar15 = mdl->opt;
LAB_001101a6:
    if (poVar15->output != (char *)0x0) {
      fclose(pFVar7);
    }
    goto switchD_0010f8d7_default;
  case 3:
    info("* Load model\n");
    pcVar8 = mdl->opt->model;
    if (pcVar8 == (char *)0x0) {
      fatal("no model file provided");
    }
    pFVar7 = fopen(pcVar8,"r");
    if (pFVar7 == (FILE *)0x0) {
      pfatal("cannot open model file %s",mdl->opt->model);
    }
    mdl_load(mdl,(FILE *)pFVar7);
    fclose(pFVar7);
    info("* Update model\n");
    pcVar8 = mdl->opt->input;
    pFVar7 = _stdin;
    if ((pcVar8 != (char *)0x0) && (pFVar7 = fopen(pcVar8,"r"), pFVar7 == (FILE *)0x0)) {
      pfatal("cannot open update file");
      pFVar7 = (FILE *)0x0;
    }
    iVar6 = feof(pFVar7);
    if (iVar6 == 0) {
      uVar24 = 0;
      do {
        pcVar8 = rdr_readline((FILE *)pFVar7);
        if (pcVar8 == (char *)0x0) break;
        uVar24 = uVar24 + 1;
        ppuVar9 = __ctype_b_loc();
        lVar16 = 0;
        pcVar21 = pcVar8;
        do {
          puVar3 = *ppuVar9;
          pcVar20 = pcVar21 + -1;
          do {
            pcVar21 = pcVar21 + 1;
            pcVar1 = pcVar20 + 1;
            pcVar20 = pcVar20 + 1;
          } while ((*(byte *)((long)puVar3 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
          if (*pcVar1 == '\0') {
LAB_0010ff9a:
            if ((int)lVar16 != 4) {
              if ((int)lVar16 != 0) {
                fatal("invalid line at %d",(ulong)uVar24);
              }
              goto LAB_001100f1;
            }
            break;
          }
          local_158[lVar16] = pcVar20;
          lVar16 = lVar16 + 1;
          cVar19 = *pcVar20;
          while( true ) {
            if (cVar19 == '\0') goto LAB_0010ff9a;
            if ((*(byte *)((long)puVar3 + (long)cVar19 * 2 + 1) & 0x20) != 0) break;
            cVar19 = *pcVar21;
            pcVar21 = pcVar21 + 1;
          }
          pcVar21[-1] = '\0';
        } while (lVar16 != 4);
        uVar10 = qrk_str2id(mdl->reader->obs,local_158[0]);
        pcVar21 = local_158[1];
        if (uVar10 == 0xffffffffffffffff) {
          fatal("bad on observation on line %d",(ulong)uVar24);
        }
        if ((*local_158[1] == '#') && (local_158[1][1] == '\0')) {
          uVar11 = 0xffffffffffffffff;
        }
        else {
          uVar11 = qrk_str2id(mdl->reader->lbl,local_158[1]);
          if (uVar11 == 0xffffffffffffffff) {
            fatal("bad label <%s> line %d",pcVar21,(ulong)uVar24);
          }
        }
        pcVar21 = local_158[2];
        uVar12 = qrk_str2id(mdl->reader->lbl,local_158[2]);
        if (uVar12 == 0xffffffffffffffff) {
          fatal("bad label <%s> line %d",pcVar21,(ulong)uVar24);
        }
        local_160 = 0.0;
        iVar6 = __isoc99_sscanf(local_158[3],"%lf",&local_160);
        if (iVar6 != 1) {
          fatal("bad weight on line %d",(ulong)uVar24);
        }
        if (uVar11 == 0xffffffffffffffff) {
          pdVar13 = mdl->theta + mdl->uoff[uVar10];
        }
        else {
          pdVar13 = mdl->theta + mdl->boff[uVar10] + uVar11 * mdl->nlbl;
        }
        pdVar13[uVar12] = local_160;
LAB_001100f1:
        free(pcVar8);
        iVar6 = feof(pFVar7);
      } while (iVar6 == 0);
    }
    poVar15 = mdl->opt;
    if (poVar15->input != (char *)0x0) {
      fclose(pFVar7);
      goto LAB_00110363;
    }
    break;
  default:
    goto switchD_0010f8d7_default;
  }
  if (poVar15->compact == true) {
    uVar10 = mdl->nobs;
    uVar11 = mdl->nftr;
    info("* Compacting the model\n");
    mdl_compact(mdl);
    info("    %8lu observations removed\n",uVar10 - mdl->nobs);
    info("    %8lu features removed\n",uVar11 - mdl->nftr);
  }
  info("* Save the model\n");
  pcVar8 = mdl->opt->output;
  pFVar7 = _stdout;
  if ((pcVar8 != (char *)0x0) && (pFVar7 = fopen(pcVar8,"w"), pFVar7 == (FILE *)0x0)) {
    pfatal("cannot open output model");
    pFVar7 = (FILE *)0x0;
  }
  mdl_save(mdl,(FILE *)pFVar7);
  if (mdl->opt->output != (char *)0x0) {
    fclose(pFVar7);
  }
  info("* Done\n");
switchD_0010f8d7_default:
  mdl_free(mdl);
  return 0;
}

Assistant:

int main(int argc, char *argv[argc]) {
	// We first parse command line switchs
	opt_t opt = opt_defaults;
	opt_parse(argc, argv, &opt);
	// Next we prepare the model
	mdl_t *mdl = mdl_new(rdr_new(opt.maxent));
	mdl->opt = &opt;
	// And switch to requested mode
	switch (opt.mode) {
		case 0: dotrain(mdl); break;
		case 1: dolabel(mdl); break;
		case 2: dodump(mdl);  break;
		case 3: doupdt(mdl);  break;
	}
	// And cleanup
	mdl_free(mdl);
	return EXIT_SUCCESS;
}